

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_statement.cpp
# Opt level: O1

void __thiscall duckdb::MultiStatement::MultiStatement(MultiStatement *this,MultiStatement *other)

{
  pointer puVar1;
  pointer pSVar2;
  pointer this_00;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> local_30;
  
  SQLStatement::SQLStatement(&this->super_SQLStatement,&other->super_SQLStatement);
  (this->super_SQLStatement)._vptr_SQLStatement = (_func_int **)&PTR__MultiStatement_02492e68;
  (this->statements).
  super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->statements).
  super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->statements).
  super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (other->statements).
            super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (other->statements).
           super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != puVar1) {
    do {
      pSVar2 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
               operator->(this_00);
      (*pSVar2->_vptr_SQLStatement[3])(&local_30,pSVar2);
      ::std::
      vector<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>,std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>>
                ((vector<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>,std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>>>
                  *)&this->statements,
                 (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                  *)&local_30);
      if (local_30._M_head_impl != (SQLStatement *)0x0) {
        (*(local_30._M_head_impl)->_vptr_SQLStatement[1])();
      }
      this_00 = this_00 + 1;
    } while (this_00 != puVar1);
  }
  return;
}

Assistant:

MultiStatement::MultiStatement(const MultiStatement &other) : SQLStatement(other) {
	for (auto &stmt : other.statements) {
		statements.push_back(stmt->Copy());
	}
}